

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportInstallFileGenerator::GetFileSetFiles_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  string *language;
  pointer pcVar1;
  _Base_ptr p_Var2;
  cmMakefile *this_00;
  cmFileSet *pcVar3;
  bool bVar4;
  int iVar5;
  cmake *cmakeInstance;
  mapped_type *ppcVar6;
  string *psVar7;
  _Rb_tree_node_base *p_Var8;
  ostream *poVar9;
  pointer puVar10;
  pointer puVar11;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *puVar12;
  long lVar13;
  _Alloc_hider _Var14;
  pointer config;
  undefined8 uVar15;
  char cVar16;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  *entry;
  _Base_ptr filename;
  bool bVar17;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  string_view str;
  string_view str_00;
  string_view separator;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  destCge;
  string prefix;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  string escapedFile;
  string unescapedDest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  fileEntries;
  string relFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  files;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  directoryEntries;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directories;
  cmGeneratorExpression destGe;
  cmFileSet *local_410;
  _Alloc_hider local_408;
  pointer local_400;
  undefined1 local_3f8 [16];
  _Base_ptr local_3e8;
  _Base_ptr local_3e0;
  cmGeneratorTarget *local_3d0;
  string *local_3c8;
  undefined1 local_3c0 [16];
  string local_3b0;
  string local_390;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_370;
  string local_358;
  string local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_300;
  string local_2e8;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  cmExportInstallFileGenerator *local_2b0;
  string *local_2a8;
  _Rb_tree_node_base *local_2a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_298;
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  local_268;
  string local_250;
  undefined1 local_218 [32];
  long *local_1f8 [2];
  long local_1e8 [2];
  undefined1 local_1d8 [16];
  _Base_ptr local_1c8;
  pointer local_1c0;
  _Base_ptr local_1b8;
  _Base_ptr local_1b0;
  _Base_ptr local_1a8;
  char *local_1a0;
  undefined8 local_198;
  size_type local_190;
  pointer local_188;
  undefined8 local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168 [33];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  cmGeneratorExpression local_48;
  
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410 = fileSet;
  local_3d0 = gte;
  local_2b0 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_370,gte->Makefile,IncludeEmptyConfig);
  cmFileSet::CompileFileEntries(&local_300,local_410);
  cmFileSet::CompileDirectoryEntries(&local_268,local_410);
  cmakeInstance = cmMakefile::GetCMakeInstance(local_3d0->Makefile);
  local_2c8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_2c8.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_2c8);
  cmGeneratorExpression::cmGeneratorExpression
            (&local_48,cmakeInstance,(cmListFileBacktrace *)&local_2c8);
  if (local_2c8.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2c8.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppcVar6 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_410);
  pcVar1 = ((*ppcVar6)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar1,
             pcVar1 + ((*ppcVar6)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_3c0,(string *)&local_48);
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  local_2a8 = local_370.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_370.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2b8 = &__return_storage_ptr__->field_2;
    language = (string *)(local_1e8 + 2);
    config = local_370.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_3c0._8_8_ = __return_storage_ptr__;
    do {
      local_3c8 = config;
      cmFileSet::EvaluateDirectoryEntries
                (&local_60,local_410,&local_268,local_3d0->LocalGenerator,config,local_3d0,
                 (cmGeneratorExpressionDAGChecker *)0x0);
      puVar10 = local_300.
                super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_298._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_298._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_298._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_298._M_impl.super__Rb_tree_header._M_header;
      local_298._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_298._M_impl.super__Rb_tree_header._M_header._M_right =
           local_298._M_impl.super__Rb_tree_header._M_header._M_left;
      for (puVar11 = local_300.
                     super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar11 != puVar10;
          puVar11 = puVar11 + 1) {
        cmFileSet::EvaluateFileEntry
                  (local_410,&local_60,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                    *)&local_298,puVar11,local_3d0->LocalGenerator,local_3c8,local_3d0,
                   (cmGeneratorExpressionDAGChecker *)0x0);
      }
      local_1d8._8_8_ = 0;
      local_1c8 = (_Base_ptr)((ulong)local_1c8 & 0xffffffffffffff00);
      uVar15 = 0;
      local_1d8._0_8_ = &local_1c8;
      psVar7 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_3c0._0_8_,local_3d0->LocalGenerator
                          ,local_3c8,local_3d0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,language);
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      pcVar1 = (psVar7->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_338,pcVar1,pcVar1 + psVar7->_M_string_length);
      if ((_Base_ptr *)local_1d8._0_8_ != &local_1c8) {
        operator_delete((void *)local_1d8._0_8_,(ulong)((long)&local_1c8->_M_color + 1));
      }
      str._M_str = &DAT_00000001;
      str._M_len = (size_t)local_338._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&local_250,(cmOutputConverter *)local_338._M_string_length,str,(WrapQuotes)uVar15);
      local_408._M_p = (pointer)local_250._M_string_length;
      local_400 = local_250._M_dataplus._M_p;
      local_1d8._0_8_ = (undefined1 *)0x0;
      local_1d8._8_8_ = &DAT_00000001;
      local_3e8 = (_Base_ptr)&local_1c0;
      local_1c0 = (pointer)CONCAT71(local_1c0._1_7_,0x2f);
      local_3f8._8_8_ = 1;
      local_3e0 = (_Base_ptr)0x0;
      views._M_len = 2;
      views._M_array = (iterator)&local_408;
      local_3f8._0_8_ = &local_250;
      local_1c8 = local_3e8;
      cmCatViews(&local_390,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,
                        (ulong)(local_250.field_2._M_allocated_capacity + 1));
      }
      bVar4 = cmsys::SystemTools::FileIsFullPath(&local_338);
      if (!bVar4) {
        local_1d8._0_8_ = (undefined1 *)0x12;
        local_1d8._8_8_ = "${_IMPORT_PREFIX}/";
        local_1c8 = (_Base_ptr)0x0;
        local_1c0 = (pointer)local_390._M_string_length;
        local_1b8 = (_Base_ptr)local_390._M_dataplus._M_p;
        local_1b0 = (_Base_ptr)0x0;
        views_00._M_len = 2;
        views_00._M_array = (iterator)language;
        cmCatViews((string *)&local_408,views_00);
        std::__cxx11::string::operator=((string *)&local_390,(string *)&local_408);
        if ((_Base_ptr)local_408._M_p != (_Base_ptr)local_3f8) {
          operator_delete(local_408._M_p,(ulong)(local_3f8._0_8_ + 1));
        }
      }
      pcVar3 = local_410;
      bVar4 = true;
      if (*(bool *)(local_3c0._0_8_ + 0x130) == false) {
        lVar13 = (long)local_268.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_268.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        puVar10 = local_268.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (0 < lVar13) {
          puVar10 = (pointer)((long)&((local_268.
                                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                     super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                     .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>.
                                     _M_head_impl +
                             ((long)local_268.
                                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_268.
                                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffffe0U)
                             );
          lVar13 = lVar13 + 1;
          puVar11 = local_268.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((puVar11[-2]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar11 = puVar11 + -2;
              goto LAB_005bbb3a;
            }
            if ((puVar11[-1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar11 = puVar11 + -1;
              goto LAB_005bbb3a;
            }
            if (((puVar11->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) goto LAB_005bbb3a;
            if ((puVar11[1]._M_t.
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition != false) {
              puVar11 = puVar11 + 1;
              goto LAB_005bbb3a;
            }
            lVar13 = lVar13 + -1;
            puVar11 = puVar11 + 4;
          } while (1 < lVar13);
        }
        lVar13 = (long)local_268.
                       super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
        if (lVar13 == 1) {
LAB_005bbb17:
          puVar11 = puVar10;
          if (((puVar10->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar11 = local_268.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
        }
        else if (lVar13 == 2) {
LAB_005bbb07:
          puVar11 = puVar10;
          if (((puVar10->_M_t).
               super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
               .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
              HadContextSensitiveCondition == false) {
            puVar10 = puVar10 + 1;
            goto LAB_005bbb17;
          }
        }
        else {
          puVar11 = local_268.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((lVar13 == 3) &&
             (puVar11 = puVar10,
             ((puVar10->_M_t).
              super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ._M_t.
              super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
              .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
             HadContextSensitiveCondition == false)) {
            puVar10 = puVar10 + 1;
            goto LAB_005bbb07;
          }
        }
LAB_005bbb3a:
        if (puVar11 ==
            local_268.
            super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar13 = (long)local_300.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_300.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          puVar10 = local_300.
                    super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (0 < lVar13) {
            puVar10 = (pointer)((long)&((local_300.
                                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                                       .
                                       super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>
                                       ._M_head_impl +
                               ((long)local_300.
                                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_300.
                                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start &
                               0xffffffffffffffe0U));
            lVar13 = lVar13 + 1;
            puVar12 = local_300.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2;
            do {
              if ((puVar12[-2]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + -2;
                goto LAB_005bbc23;
              }
              if ((puVar12[-1]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + -1;
                goto LAB_005bbc23;
              }
              if (((puVar12->_M_t).
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) goto LAB_005bbc23;
              if ((puVar12[1]._M_t.
                   super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                   .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                  HadContextSensitiveCondition != false) {
                puVar12 = puVar12 + 1;
                goto LAB_005bbc23;
              }
              lVar13 = lVar13 + -1;
              puVar12 = puVar12 + 4;
            } while (1 < lVar13);
          }
          lVar13 = (long)local_300.
                         super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)puVar10 >> 3;
          if (lVar13 == 1) {
LAB_005bbc00:
            puVar12 = puVar10;
            if (((puVar10->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar12 = local_300.
                        super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            }
          }
          else if (lVar13 == 2) {
LAB_005bbbf0:
            puVar12 = puVar10;
            if (((puVar10->_M_t).
                 super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                 .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
                HadContextSensitiveCondition == false) {
              puVar10 = puVar10 + 1;
              goto LAB_005bbc00;
            }
          }
          else {
            puVar12 = local_300.
                      super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if ((lVar13 == 3) &&
               (puVar12 = puVar10,
               ((puVar10->_M_t).
                super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
                .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl)->
               HadContextSensitiveCondition == false)) {
              puVar10 = puVar10 + 1;
              goto LAB_005bbbf0;
            }
          }
LAB_005bbc23:
          bVar4 = puVar12 !=
                  local_300.
                  super__Vector_base<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      p_Var8 = local_298._M_impl.super__Rb_tree_header._M_header._M_left;
      if (((bVar4) && ((local_410->Type)._M_string_length == 0xb)) &&
         (iVar5 = bcmp((local_410->Type)._M_dataplus._M_p,"CXX_MODULES",0xb),
         p_Var8 = local_298._M_impl.super__Rb_tree_header._M_header._M_left, iVar5 == 0)) {
        this_00 = local_2b0->IEGen->LocalGenerator->Makefile;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)language);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)language,"The \"",5);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(local_3d0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)language,(psVar7->_M_dataplus)._M_p,psVar7->_M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" target\'s interface file set \"",0x1f);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(local_410->Name)._M_dataplus._M_p,
                            (local_410->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(pcVar3->Type)._M_dataplus._M_p,(pcVar3->Type)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\" contains context-sensitive base file entries which is not supported.",
                   0x46);
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)&local_408);
        if ((_Base_ptr)local_408._M_p != (_Base_ptr)local_3f8) {
          operator_delete(local_408._M_p,(ulong)(local_3f8._0_8_ + 1));
        }
        (((cmListFileContext *)local_3c0._8_8_)->Name)._M_dataplus._M_p = (pointer)local_2b8;
        (((cmListFileContext *)local_3c0._8_8_)->Name)._M_string_length = 0;
        (((cmListFileContext *)local_3c0._8_8_)->Name).field_2._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)language);
        std::ios_base::~ios_base((ios_base *)local_168);
        cVar16 = '\x01';
LAB_005bc0f3:
        bVar4 = false;
      }
      else {
        while ((_Rb_tree_header *)p_Var8 != &local_298._M_impl.super__Rb_tree_header) {
          if (p_Var8[1]._M_parent == (_Base_ptr)0x0) {
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)(local_3c0 + 0x10),"");
          }
          else {
            local_400 = *(pointer *)(p_Var8 + 1);
            local_408._M_p = (pointer)p_Var8[1]._M_parent;
            local_3f8._0_8_ = (string *)0x0;
            local_1d8._0_8_ = (undefined1 *)0x0;
            local_1d8._8_8_ = &DAT_00000001;
            local_3e8 = (_Base_ptr)&local_1c0;
            local_1c0 = (pointer)CONCAT71(local_1c0._1_7_,0x2f);
            local_3f8._8_8_ = 1;
            local_3e0 = (_Base_ptr)0x0;
            views_01._M_len = 2;
            views_01._M_array = (iterator)&local_408;
            local_1c8 = local_3e8;
            cmCatViews((string *)(local_3c0 + 0x10),views_01);
          }
          p_Var2 = p_Var8[2]._M_parent;
          local_2a0 = p_Var8;
          for (filename = *(_Base_ptr *)(p_Var8 + 2); filename != p_Var2; filename = filename + 1) {
            cmsys::SystemTools::GetFilenameName((string *)&local_408,(string *)filename);
            local_1d8._0_8_ = local_3b0._M_string_length;
            local_1d8._8_8_ = local_3b0._M_dataplus._M_p;
            local_1c8 = (_Base_ptr)0x0;
            local_1c0 = local_400;
            local_1b8 = (_Base_ptr)local_408._M_p;
            views_02._M_len = 2;
            views_02._M_array = (iterator)language;
            local_1b0 = (_Base_ptr)&local_408;
            cmCatViews(&local_2e8,views_02);
            if ((_Base_ptr)local_408._M_p != (_Base_ptr)local_3f8) {
              operator_delete(local_408._M_p,(ulong)(local_3f8._0_8_ + 1));
            }
            str_00._M_str = &DAT_00000001;
            str_00._M_len = (size_t)local_2e8._M_dataplus._M_p;
            cmOutputConverter::EscapeForCMake_abi_cxx11_
                      ((string *)&local_408,(cmOutputConverter *)local_2e8._M_string_length,str_00,
                       (WrapQuotes)uVar15);
            local_1d8._0_8_ = local_390._M_string_length;
            local_1d8._8_8_ = local_390._M_dataplus._M_p;
            local_1c8 = (_Base_ptr)0x0;
            local_1c0 = local_400;
            local_1b8 = (_Base_ptr)local_408._M_p;
            views_03._M_len = 2;
            views_03._M_array = (iterator)language;
            local_1b0 = (_Base_ptr)&local_408;
            cmCatViews(&local_358,views_03);
            if ((_Base_ptr)local_408._M_p != (_Base_ptr)local_3f8) {
              operator_delete(local_408._M_p,(ulong)(local_3f8._0_8_ + 1));
            }
            if ((bVar4) &&
               ((long)local_370.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_370.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start != 0x20)) {
              local_1d8._0_8_ = (undefined1 *)0xc;
              local_1d8._8_8_ = "\"$<$<CONFIG:";
              local_1c8 = (_Base_ptr)0x0;
              local_1b8 = (_Base_ptr)(local_3c8->_M_dataplus)._M_p;
              local_1c0 = (pointer)local_3c8->_M_string_length;
              local_1b0 = (_Base_ptr)0x0;
              local_1a8 = (_Base_ptr)0x2;
              local_1a0 = ">:";
              local_198 = 0;
              local_190 = local_358._M_string_length;
              local_188 = local_358._M_dataplus._M_p;
              local_180 = 0;
              local_178 = 2;
              local_170 = ">\"";
              local_168[0] = 0;
              views_05._M_len = 5;
              views_05._M_array = (iterator)language;
              cmCatViews((string *)&local_408,views_05);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_318,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_408);
              psVar7 = (string *)local_3f8._0_8_;
              _Var14._M_p = local_408._M_p;
              if ((_Base_ptr)local_408._M_p != (_Base_ptr)local_3f8) {
LAB_005bc030:
                operator_delete(_Var14._M_p,(ulong)((long)&(psVar7->_M_dataplus)._M_p + 1));
              }
            }
            else {
              local_408._M_p = (pointer)0x0;
              local_400 = &DAT_00000001;
              local_3f8._0_8_ = local_3f8 + 8;
              local_3f8[8] = 0x22;
              local_1d8._0_8_ = &DAT_00000001;
              local_1c8 = (_Base_ptr)0x0;
              local_1c0 = (pointer)local_358._M_string_length;
              local_1b8 = (_Base_ptr)local_358._M_dataplus._M_p;
              local_1b0 = (_Base_ptr)0x0;
              local_250._M_dataplus._M_p = (pointer)0x0;
              local_250._M_string_length = (size_type)&DAT_00000001;
              local_250.field_2._M_allocated_capacity = (long)&local_250.field_2 + 8;
              local_250.field_2._M_local_buf[8] = '\"';
              local_1a8 = (_Base_ptr)&DAT_00000001;
              local_198 = 0;
              views_04._M_len = 3;
              views_04._M_array = (iterator)language;
              local_1d8._8_8_ = local_3f8._0_8_;
              local_1a0 = (char *)local_250.field_2._M_allocated_capacity;
              cmCatViews((string *)local_218,views_04);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_318,(string *)local_218);
              psVar7 = (string *)local_218._16_8_;
              _Var14._M_p = (pointer)local_218._0_8_;
              if ((_Base_ptr)local_218._0_8_ != (_Base_ptr)(local_218 + 0x10)) goto LAB_005bc030;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_358._M_dataplus._M_p != &local_358.field_2) {
              operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
              operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_2a0);
        }
        if (!bVar4) {
          cVar16 = '\x02';
          goto LAB_005bc0f3;
        }
        bVar17 = (long)local_370.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_370.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x20;
        bVar4 = !bVar17;
        cVar16 = bVar17 * '\x02';
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree(&local_298);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_60);
      if (!bVar4) goto LAB_005bc2bd;
      config = local_3c8 + 1;
    } while (config != local_2a8);
    cVar16 = '\x02';
LAB_005bc2bd:
    __return_storage_ptr__ = (string *)local_3c0._8_8_;
    if (cVar16 != '\x02') goto LAB_005bc2ea;
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&local_318,separator,(string_view)ZEXT816(0));
LAB_005bc2ea:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_3c0);
  cmGeneratorExpression::~cmGeneratorExpression(&local_48);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_268);
  std::
  vector<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>,_std::allocator<std::unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>_>_>
  ::~vector(&local_300);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_370);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  return (string *)(element_type *)__return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetFiles(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto fileEntries = fileSet->CompileFileEntries();
  auto directoryEntries = fileSet->CompileDirectoryEntries();

  cmGeneratorExpression destGe(*gte->Makefile->GetCMakeInstance());
  auto destCge =
    destGe.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto directories = fileSet->EvaluateDirectoryEntries(
      directoryEntries, gte->LocalGenerator, config, gte);

    std::map<std::string, std::vector<std::string>> files;
    for (auto const& entry : fileEntries) {
      fileSet->EvaluateFileEntry(directories, files, entry,
                                 gte->LocalGenerator, config, gte);
    }
    auto unescapedDest = destCge->Evaluate(gte->LocalGenerator, config, gte);
    auto dest =
      cmStrCat(cmOutputConverter::EscapeForCMake(
                 unescapedDest, cmOutputConverter::WrapQuotes::NoWrap),
               '/');
    if (!cmSystemTools::FileIsFullPath(unescapedDest)) {
      dest = cmStrCat("${_IMPORT_PREFIX}/", dest);
    }

    bool const contextSensitive = destCge->GetHadContextSensitiveCondition() ||
      std::any_of(directoryEntries.begin(), directoryEntries.end(),
                  EntryIsContextSensitive) ||
      std::any_of(fileEntries.begin(), fileEntries.end(),
                  EntryIsContextSensitive);

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (contextSensitive && type == "CXX_MODULES"_s) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    for (auto const& it : files) {
      auto prefix = it.first.empty() ? "" : cmStrCat(it.first, '/');
      for (auto const& filename : it.second) {
        auto relFile =
          cmStrCat(prefix, cmSystemTools::GetFilenameName(filename));
        auto escapedFile =
          cmStrCat(dest,
                   cmOutputConverter::EscapeForCMake(
                     relFile, cmOutputConverter::WrapQuotes::NoWrap));
        if (contextSensitive && configs.size() != 1) {
          resultVector.push_back(
            cmStrCat("\"$<$<CONFIG:", config, ">:", escapedFile, ">\""));
        } else {
          resultVector.emplace_back(cmStrCat('"', escapedFile, '"'));
        }
      }
    }

    if (!(contextSensitive && configs.size() != 1)) {
      break;
    }
  }

  return cmJoin(resultVector, " ");
}